

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O1

void pelelm_dcma(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
                Real param_7,int *param_8,int param_9)

{
  Box *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Real RVar17;
  int iVar18;
  long lVar19;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  double *pdVar30;
  long lVar31;
  Array<Real,_9> *pAVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  int n;
  long lVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  long lVar43;
  bool bVar44;
  byte bVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  long local_358;
  double *local_350;
  double *local_348;
  double local_2a8 [11];
  double local_250 [15];
  int local_1d8;
  int iStack_1d4;
  int local_158;
  int iStack_154;
  double local_78 [8];
  undefined1 *local_38;
  long lVar20;
  
  bVar45 = 0;
  pdVar13 = (datfab->super_BaseFab<double>).dptr;
  pBVar1 = &(datfab->super_BaseFab<double>).domain;
  iVar18 = (pBVar1->smallend).vect[0];
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  uVar15 = *(undefined8 *)(pBVar1->smallend).vect;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar4 = (datfab->super_BaseFab<double>).domain.bigend.vect[0];
  iVar5 = (datfab->super_BaseFab<double>).domain.bigend.vect[1];
  iVar6 = (datfab->super_BaseFab<double>).domain.bigend.vect[2];
  pdVar14 = (derfab->super_BaseFab<double>).dptr;
  pBVar1 = &(derfab->super_BaseFab<double>).domain;
  iVar7 = (pBVar1->smallend).vect[0];
  iVar8 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  uVar16 = *(undefined8 *)(pBVar1->smallend).vect;
  iVar9 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  iVar10 = (derfab->super_BaseFab<double>).domain.bigend.vect[0];
  iVar11 = (derfab->super_BaseFab<double>).domain.bigend.vect[1];
  iVar12 = (derfab->super_BaseFab<double>).domain.bigend.vect[2];
  amrex::Abort_host("C12H25O2 is not present in your chemistry: do not use dcma.");
  RVar17 = PeleLM::Zox;
  lVar40 = (long)iVar11 + 1;
  lVar19 = ((long)iVar10 - (long)iVar7) + 1;
  lVar23 = (lVar40 - iVar8) * lVar19;
  lVar34 = ((long)iVar12 + 1) - (long)iVar9;
  lVar27 = lVar23 * lVar34;
  lVar24 = lVar27 * (dcomp + 1);
  lVar31 = lVar27 * dcomp;
  lVar28 = ((int)lVar40 - iVar8) * lVar19;
  lVar41 = (long)iVar5 + 1;
  lVar39 = ((long)iVar4 - (long)iVar18) + 1;
  lVar43 = (lVar41 - iVar2) * lVar39;
  lVar29 = lVar43 * (((long)iVar6 + 1) - (long)iVar3);
  dVar48 = PeleLM::Zfu - PeleLM::Zox;
  pAVar32 = &PeleLM::spec_Bilger_fact;
  pdVar30 = local_250 + 2;
  for (lVar40 = 9; lVar40 != 0; lVar40 = lVar40 + -1) {
    *pdVar30 = pAVar32->_M_elems[0];
    pAVar32 = (Array<Real,_9> *)((long)pAVar32 + ((ulong)bVar45 * -2 + 1) * 8);
    pdVar30 = pdVar30 + (ulong)bVar45 * -2 + 1;
  }
  iVar18 = (bx->smallend).vect[2];
  iVar4 = (bx->bigend).vect[2];
  if (iVar18 <= iVar4) {
    iVar5 = (bx->bigend).vect[0];
    iVar6 = (bx->bigend).vect[1];
    iVar7 = (bx->smallend).vect[1];
    lVar33 = (long)iVar7;
    iVar8 = (bx->smallend).vect[0];
    lVar40 = (long)iVar8 * 8;
    do {
      lVar20 = (long)iVar18;
      if (iVar7 <= iVar6) {
        local_1d8 = (int)uVar15;
        iStack_1d4 = (int)((ulong)uVar15 >> 0x20);
        lVar25 = (lVar20 - iVar9) * lVar23;
        local_158 = (int)uVar16;
        iStack_154 = (int)((ulong)uVar16 >> 0x20);
        lVar35 = (lVar20 - iVar9) * lVar23;
        local_348 = (double *)
                    ((long)pdVar13 +
                    (lVar33 - iStack_1d4) * lVar39 * 8 + (lVar20 - iVar3) * lVar43 * 8 +
                    (long)local_1d8 * -8 + lVar40 + lVar29 * 8);
        local_350 = (double *)
                    ((long)pdVar14 +
                    (lVar33 - iStack_154) * lVar19 * 8 + (lVar20 - iVar9) * lVar23 * 8 +
                    (long)local_158 * -8 + lVar40 + lVar27 * 0x58);
        local_358 = lVar33;
        do {
          if (iVar8 <= iVar5) {
            lVar21 = (local_358 - iStack_154) * lVar19;
            lVar22 = (local_358 - iStack_154) * lVar19;
            lVar26 = (long)iVar8;
            pdVar30 = local_350;
            pdVar42 = local_348;
            do {
              dVar47 = pdVar13[(lVar20 - iVar3) * ((int)lVar41 - iVar2) * lVar39 +
                               (local_358 - iStack_1d4) * lVar39 + (lVar26 - local_1d8)];
              lVar38 = lVar26 - local_158;
              pdVar14[lVar31 + lVar25 + lVar21 + lVar38] = 0.0;
              dVar46 = 0.0;
              lVar36 = 2;
              pdVar37 = pdVar42;
              do {
                dVar46 = dVar46 + *pdVar37 * local_250[lVar36] * (1.0 / dVar47);
                pdVar14[lVar31 + lVar25 + lVar21 + lVar38] = dVar46;
                lVar36 = lVar36 + 1;
                pdVar37 = pdVar37 + lVar29;
              } while (lVar36 != 0xb);
              pdVar14[lVar31 + lVar25 + lVar21 + lVar38] = (dVar46 - RVar17) * (1.0 / dVar48);
              dVar47 = pdVar14[lVar34 * lVar28 * 10 +
                               (lVar20 - iVar9) * lVar28 +
                               (local_358 - iStack_154) * lVar19 + (lVar26 - local_158)];
              dVar49 = dVar47 * dVar47;
              dVar50 = dVar47 * dVar49;
              dVar51 = dVar47 * dVar50;
              dVar46 = 1.0 / dVar47;
              local_2a8[3] = dVar46 * 25471.627 +
                             dVar51 * 0.0 + dVar50 * 0.0 + dVar49 * 0.0 + dVar47 * 0.0 + 2.5;
              local_78[0] = 0.49603174603174605;
              local_78[1] = 0.03125195324707794;
              local_78[2] = 0.055509297807382736;
              local_78[3] = 0.9920634920634921;
              local_78[4] = 0.06250390649415588;
              local_78[5] = 0.05879931792791203;
              local_78[6] = 0.030297521662727988;
              local_78[7] = 0.029399658963956014;
              local_38 = &DAT_3fa246cdaf410bdd;
              if (1000.0 <= dVar47) {
                local_2a8[0] = dVar46 * -835.033997 +
                               dVar51 * 3.16550358e-16 +
                               dVar50 * -2.30789455e-12 +
                               dVar49 * -1.8779429e-08 + dVar47 * 0.000350032206 + 2.99142337;
                local_2a8[1] = dVar46 * -1233.93018 +
                               dVar51 * -2.27287062e-16 +
                               dVar50 * 4.4382037e-12 +
                               dVar49 * -4.19613997e-08 + dVar47 * 0.000306759845 + 3.69757819;
                local_2a8[2] = dVar46 * -29899.209 +
                               dVar51 * -1.27832357e-15 +
                               dVar50 * 3.00249098e-11 +
                               dVar49 * -2.9100867e-07 + dVar47 * 0.00152814644 + 2.67214561;
                local_2a8[4] = dVar46 * 29230.8027 +
                               dVar51 * -8.736103e-17 +
                               dVar50 * 1.13776685e-12 +
                               dVar49 * -1.03426778e-09 + dVar47 * -1.37753096e-05 + 2.54205966;
                local_2a8[5] = dVar46 * 3683.62875 +
                               dVar51 * -2.66391752e-16 +
                               dVar50 * 7.63046685e-12 +
                               dVar49 * -8.63609193e-08 + dVar47 * 0.00052825224 + 2.86472886;
                local_2a8[6] = dVar46 * 111.856713 +
                               dVar51 * -2.1581707e-15 +
                               dVar50 * 2.85615925e-11 +
                               dVar49 * -2.11219383e-07 + dVar47 * 0.00111991006 + 4.0172109;
                local_2a8[7] = dVar46 * -18006.9609 +
                               dVar51 * -2.86330712e-15 +
                               dVar50 * 5.87225893e-11 +
                               dVar49 * -4.9156294e-07 + dVar47 * 0.0021680682 + 4.57316685;
                dVar49 = dVar51 * -1.3506702e-15 +
                         dVar50 * 2.52426e-11 +
                         dVar49 * -1.89492033e-07 + dVar47 * 0.0007439885 + 2.92664;
                dVar46 = dVar46 * -922.7977;
              }
              else {
                local_2a8[0] = dVar46 * -1012.52087 +
                               dVar51 * 8.26974448e-14 +
                               dVar50 * -2.36885858e-11 +
                               dVar49 * -2.71433843e-07 + dVar47 * 0.000412472087 + 3.29812431;
                local_2a8[1] = dVar46 * -1005.24902 +
                               dVar51 * -1.75371078e-13 +
                               dVar50 * 3.28469308e-10 +
                               dVar49 * -1.91871682e-07 + dVar47 * 0.000563743175 + 3.2129364;
                local_2a8[2] = dVar46 * -30208.1133 +
                               dVar51 * -5.01317694e-13 +
                               dVar50 * 1.74214532e-09 +
                               dVar49 * -2.11823211e-06 + dVar47 * 0.00173749123 + 3.38684249;
                local_2a8[4] = dVar46 * 29147.6445 +
                               dVar51 * 7.78139272e-14 +
                               dVar50 * -4.00710797e-10 +
                               dVar49 * 8.07010567e-07 + dVar47 * -0.000819083245 + 2.94642878;
                local_2a8[5] = dVar46 * 3346.30913 +
                               dVar51 * 4.12474758e-13 +
                               dVar50 * -1.44963411e-09 +
                               dVar49 * 2.1758823e-06 + dVar47 * -0.0016127247 + 4.12530561;
                local_2a8[6] = dVar46 * 294.80804 +
                               dVar51 * 1.85845025e-12 +
                               dVar50 * -6.06909735e-09 +
                               dVar49 * 7.05276303e-06 + dVar47 * -0.00237456025 + 4.30179801;
                local_2a8[7] = dVar46 * -17663.1465 +
                               dVar51 * 4.9430295e-13 +
                               dVar50 * -1.15645138e-09 +
                               dVar49 * -4.95004193e-08 + dVar47 * 0.0032846129 + 3.38875365;
                dVar49 = dVar51 * -4.88971e-13 +
                         dVar50 * 1.41037875e-09 +
                         dVar49 * -1.321074e-06 + dVar47 * 0.00070412 + 3.298677;
                dVar46 = dVar46 * -1020.9;
              }
              local_2a8[8] = dVar46 + dVar49;
              lVar36 = 0;
              do {
                local_2a8[lVar36] = local_78[lVar36] * dVar47 * 83144626.1815324 * local_2a8[lVar36]
                ;
                lVar36 = lVar36 + 1;
              } while (lVar36 != 9);
              pdVar14[lVar24 + lVar35 + lVar22 + (lVar26 - local_158)] = 0.0;
              dVar47 = 0.0;
              lVar36 = 0;
              pdVar37 = pdVar30;
              do {
                dVar46 = local_2a8[lVar36];
                local_2a8[lVar36] = dVar46 * 0.0001;
                dVar47 = dVar47 - dVar46 * 0.0001 * *pdVar37;
                pdVar14[lVar24 + lVar35 + lVar22 + (lVar26 - local_158)] = dVar47;
                lVar36 = lVar36 + 1;
                pdVar37 = pdVar37 + lVar27;
              } while (lVar36 != 9);
              lVar26 = lVar26 + 1;
              pdVar42 = pdVar42 + 1;
              pdVar30 = pdVar30 + 1;
            } while (iVar5 + 1 != (int)lVar26);
          }
          local_358 = local_358 + 1;
          local_348 = local_348 + lVar39;
          local_350 = local_350 + lVar19;
        } while (iVar6 + 1 != (int)local_358);
      }
      bVar44 = iVar18 != iVar4;
      iVar18 = iVar18 + 1;
    } while (bVar44);
  }
  return;
}

Assistant:

void pelelm_dcma (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                              const FArrayBox& datfab, const Geometry& /*geomdata*/,
                              Real /*time*/, const int* /*bcrec*/, int /*level*/)

{   
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).enclosedCells().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 2*NUM_SPECIES+2);
    AMREX_ASSERT(ncomp == 4);
    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto const Temp      = derfab.array(NUM_SPECIES+1);
    auto const rhoY_dot  = derfab.array(NUM_SPECIES+2);
    auto       mixt_frac = derfab.array(dcomp);
    auto       hr        = derfab.array(dcomp+1);

#ifdef C12H25O2_ID
    auto       Y1        = derfab.array(dcomp+2);
    auto       Y2        = derfab.array(dcomp+3);
    int        OH        = OH_ID;
    int        RO2       = C12H25O2_ID;
#else
    amrex::Abort("C12H25O2 is not present in your chemistry: do not use dcma.");
#endif

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx, 
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {   
        // Z
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
        auto eos = pele::physics::PhysicsType::eos();
        // HR
        amrex::Real hi_spec[NUM_SPECIES] = {0.0};
        eos.T2Hi(Temp(i,j,k),hi_spec);
        hr(i,j,k) = 0.0;
        for (int n = 0; n < NUM_SPECIES; n++) {
            hi_spec[n] *= 0.0001;   // erg/g -> J/kg
            hr(i,j,k) -= rhoY_dot(i,j,k,n)*hi_spec[n];
        }

        // Y
#ifdef C12H25O2_ID
        amrex::Real rho_inv = 1.0 / density(i,j,k);
        Y1(i,j,k) = rhoY(i,j,k,OH)  * rho_inv; 
        Y2(i,j,k) = rhoY(i,j,k,RO2) * rho_inv; 
#endif
    });
}